

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O2

MDD lddmc_refs_refs_up(lddmc_refs_internal_t lddmc_refs_key,MDD res)

{
  MDD *pMVar1;
  long lVar2;
  
  lVar2 = (long)lddmc_refs_key->rend - (long)lddmc_refs_key->rbegin;
  pMVar1 = (MDD *)realloc(lddmc_refs_key->rbegin,lVar2 * 2);
  lddmc_refs_key->rbegin = pMVar1;
  lddmc_refs_key->rcur = (MDD *)((long)pMVar1 + lVar2);
  lddmc_refs_key->rend = (MDD *)((long)pMVar1 + lVar2 * 2);
  return res;
}

Assistant:

MDD __attribute__((noinline))
lddmc_refs_refs_up(lddmc_refs_internal_t lddmc_refs_key, MDD res)
{
    long size = lddmc_refs_key->rend - lddmc_refs_key->rbegin;
    lddmc_refs_key->rbegin = (MDD*)realloc(lddmc_refs_key->rbegin, sizeof(MDD) * size * 2);
    lddmc_refs_key->rcur = lddmc_refs_key->rbegin + size;
    lddmc_refs_key->rend = lddmc_refs_key->rbegin + (size * 2);
    return res;
}